

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

vm_intcls_ext * __thiscall CVmObjClass::alloc_ext(CVmObjClass *this)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  long in_RDI;
  vm_intcls_ext *ext;
  vm_intcls_ext *local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x20,in_RDI);
    local_8 = (vm_intcls_ext *)CONCAT44(extraout_var,iVar1);
    *(vm_intcls_ext **)(in_RDI + 8) = local_8;
  }
  else {
    local_8 = *(vm_intcls_ext **)(in_RDI + 8);
  }
  return local_8;
}

Assistant:

vm_intcls_ext *CVmObjClass::alloc_ext(VMG0_)
{
    /* if I already have an extension, return it */
    if (ext_ != 0)
        return (vm_intcls_ext *)ext_;

    /* allocate the new extension */
    vm_intcls_ext *ext = (vm_intcls_ext *)G_mem->get_var_heap()->alloc_mem(
        sizeof(vm_intcls_ext), this);

    /* save it */
    ext_ = (char *)ext;

    /* return it */
    return ext;
}